

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MADPComponentDiscreteActions.cpp
# Opt level: O0

void __thiscall
MADPComponentDiscreteActions::~MADPComponentDiscreteActions(MADPComponentDiscreteActions *this)

{
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar1;
  bool bVar2;
  reference ppJVar3;
  reference ppVar4;
  undefined8 *in_RDI;
  iterator last2;
  iterator it2;
  iterator last;
  iterator it;
  map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>_>
  *in_stack_ffffffffffffff78;
  map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>_>
  *in_stack_ffffffffffffff80;
  void *pvVar5;
  __normal_iterator<std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>_*,_std::vector<std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>,_std::allocator<std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>_>_>_>
  *in_stack_ffffffffffffff88;
  iterator __position;
  iterator in_stack_ffffffffffffff90;
  __normal_iterator<JointActionDiscrete_**,_std::vector<JointActionDiscrete_*,_std::allocator<JointActionDiscrete_*>_>_>
  local_28;
  vector<ActionDiscrete,_std::allocator<ActionDiscrete>_> *local_20;
  vector<ActionDiscrete,_std::allocator<ActionDiscrete>_> *local_18;
  __normal_iterator<std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>_*,_std::vector<std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>,_std::allocator<std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>_>_>_>
  local_10 [2];
  
  *in_RDI = &PTR__MADPComponentDiscreteActions_00d3fa78;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::clear
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0xacc8e3);
  local_10[0]._M_current =
       (vector<ActionDiscrete,_std::allocator<ActionDiscrete>_> *)
       std::
       vector<std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>,_std::allocator<std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>_>_>
       ::begin((vector<std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>,_std::allocator<std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>_>_>
                *)in_stack_ffffffffffffff78);
  local_18 = (vector<ActionDiscrete,_std::allocator<ActionDiscrete>_> *)
             std::
             vector<std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>,_std::allocator<std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>_>_>
             ::end((vector<std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>,_std::allocator<std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>_>_>
                    *)in_stack_ffffffffffffff78);
  while (bVar2 = __gnu_cxx::operator!=
                           ((__normal_iterator<std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>_*,_std::vector<std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>,_std::allocator<std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>_>_>_>
                             *)in_stack_ffffffffffffff80,
                            (__normal_iterator<std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>_*,_std::vector<std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>,_std::allocator<std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>_>_>_>
                             *)in_stack_ffffffffffffff78), bVar2) {
    __gnu_cxx::
    __normal_iterator<std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>_*,_std::vector<std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>,_std::allocator<std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>_>_>_>
    ::operator*(local_10);
    std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>::clear
              ((vector<ActionDiscrete,_std::allocator<ActionDiscrete>_> *)0xacc930);
    local_20 = (vector<ActionDiscrete,_std::allocator<ActionDiscrete>_> *)
               __gnu_cxx::
               __normal_iterator<std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>_*,_std::vector<std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>,_std::allocator<std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>_>_>_>
               ::operator++(in_stack_ffffffffffffff88,
                            (int)((ulong)in_stack_ffffffffffffff80 >> 0x20));
  }
  std::
  vector<std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>,_std::allocator<std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>_>_>
  ::clear((vector<std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>,_std::allocator<std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>_>_>
           *)0xacc951);
  local_28._M_current =
       (JointActionDiscrete **)
       std::vector<JointActionDiscrete_*,_std::allocator<JointActionDiscrete_*>_>::begin
                 ((vector<JointActionDiscrete_*,_std::allocator<JointActionDiscrete_*>_> *)
                  in_stack_ffffffffffffff78);
  std::vector<JointActionDiscrete_*,_std::allocator<JointActionDiscrete_*>_>::end
            ((vector<JointActionDiscrete_*,_std::allocator<JointActionDiscrete_*>_> *)
             in_stack_ffffffffffffff78);
  while (bVar2 = __gnu_cxx::operator!=
                           ((__normal_iterator<JointActionDiscrete_**,_std::vector<JointActionDiscrete_*,_std::allocator<JointActionDiscrete_*>_>_>
                             *)in_stack_ffffffffffffff80,
                            (__normal_iterator<JointActionDiscrete_**,_std::vector<JointActionDiscrete_*,_std::allocator<JointActionDiscrete_*>_>_>
                             *)in_stack_ffffffffffffff78), bVar2) {
    ppJVar3 = __gnu_cxx::
              __normal_iterator<JointActionDiscrete_**,_std::vector<JointActionDiscrete_*,_std::allocator<JointActionDiscrete_*>_>_>
              ::operator*(&local_28);
    if (*ppJVar3 != (JointActionDiscrete *)0x0) {
      (*((*ppJVar3)->super_JointAction)._vptr_JointAction[1])();
    }
    __gnu_cxx::
    __normal_iterator<JointActionDiscrete_**,_std::vector<JointActionDiscrete_*,_std::allocator<JointActionDiscrete_*>_>_>
    ::operator++((__normal_iterator<JointActionDiscrete_**,_std::vector<JointActionDiscrete_*,_std::allocator<JointActionDiscrete_*>_>_>
                  *)in_stack_ffffffffffffff88,(int)((ulong)in_stack_ffffffffffffff80 >> 0x20));
  }
  std::vector<JointActionDiscrete_*,_std::allocator<JointActionDiscrete_*>_>::clear
            ((vector<JointActionDiscrete_*,_std::allocator<JointActionDiscrete_*>_> *)0xacc9d0);
  if (in_RDI[7] != 0) {
    while (bVar2 = std::
                   map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>_>
                   ::empty((map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>_>
                            *)0xacc9f0), ((bVar2 ^ 0xffU) & 1) != 0) {
      std::
      map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>_>
      ::begin(in_stack_ffffffffffffff78);
      ppVar4 = std::
               _Rb_tree_iterator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
               ::operator*((_Rb_tree_iterator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
                            *)0xacca18);
      pvVar1 = ppVar4->second;
      if (pvVar1 != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   in_stack_ffffffffffffff90._M_node);
        operator_delete(pvVar1,0x18);
      }
      __position._M_node = (_Base_ptr)in_RDI[7];
      std::
      map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>_>
      ::begin(in_stack_ffffffffffffff78);
      in_stack_ffffffffffffff90 =
           std::
           map<unsigned_int,std::vector<unsigned_int,std::allocator<unsigned_int>>*,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::vector<unsigned_int,std::allocator<unsigned_int>>*>>>
           ::erase_abi_cxx11_(in_stack_ffffffffffffff80,__position);
    }
    pvVar5 = (void *)in_RDI[7];
    if (pvVar5 != (void *)0x0) {
      std::
      map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>_>
      ::~map((map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>_>
              *)0xacca9b);
      operator_delete(pvVar5,0x30);
    }
  }
  if ((void *)in_RDI[3] != (void *)0x0) {
    operator_delete__((void *)in_RDI[3]);
  }
  std::
  vector<std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>,_std::allocator<std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>_>_>
  ::~vector((vector<std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>,_std::allocator<std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>_>_>
             *)in_stack_ffffffffffffff90._M_node);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             in_stack_ffffffffffffff90._M_node);
  std::vector<JointActionDiscrete_*,_std::allocator<JointActionDiscrete_*>_>::~vector
            ((vector<JointActionDiscrete_*,_std::allocator<JointActionDiscrete_*>_> *)
             in_stack_ffffffffffffff90._M_node);
  return;
}

Assistant:

MADPComponentDiscreteActions::~MADPComponentDiscreteActions()
{
    _m_nrActions.clear();
    vector<vector<ActionDiscrete> >::iterator it = _m_actionVecs.begin();
    vector<vector<ActionDiscrete> >::iterator last = _m_actionVecs.end();
    while(it != last)
    {
        // (*it) isa vector<ActionDiscrete>
        (*it).clear();
        it++;
    }
    _m_actionVecs.clear();
    vector<JointActionDiscrete*>::iterator it2 = _m_jointActionVec.begin();
    vector<JointActionDiscrete*>::iterator last2 = _m_jointActionVec.end();
    while(it2 != last2)
    {
        delete *it2; //removes the joint action pointed to...
        it2++;
    }
    _m_jointActionVec.clear();
    if(_m_jointActionIndices)
    {
        while(!_m_jointActionIndices->empty())
        {
            delete (*_m_jointActionIndices->begin()).second;
            _m_jointActionIndices->erase( _m_jointActionIndices->begin() );
        }
        delete _m_jointActionIndices;
    }
//     if(_m_jointActionIndices)
//     {
//         vector<vector<Index>*>::iterator it3 = _m_jointActionIndices->begin();
//         vector<vector<Index>*>::iterator last3 = _m_jointActionIndices->end();
//         while(it3 != last3)
//         {
//             delete *it3;
//             it3++;
//         }
//     }

    delete[] _m_actionStepSize;
}